

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TextureCubeFilteringCase::TextureCubeFilteringCase
          (TextureCubeFilteringCase *this,TestContext *testCtx,RenderContext *renderCtx,
          ContextInfo *ctxInfo,char *name,char *desc,deUint32 minFilter,deUint32 magFilter,
          deUint32 wrapS,deUint32 wrapT,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeFilteringCase_0212ba28;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = ctxInfo;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = 0;
  this->m_dataType = 0;
  this->m_width = 0;
  this->m_height = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_filenames,filenames);
  (this->m_cases).
  super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textures).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  this->m_caseNdx = 0;
  return;
}

Assistant:

TextureCubeFilteringCase::TextureCubeFilteringCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const glu::ContextInfo& ctxInfo, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, const std::vector<std::string>& filenames)
	: TestCase					(testCtx, name, desc)
	, m_renderCtx				(renderCtx)
	, m_renderCtxInfo			(ctxInfo)
	, m_minFilter				(minFilter)
	, m_magFilter				(magFilter)
	, m_wrapS					(wrapS)
	, m_wrapT					(wrapT)
	, m_format					(GL_NONE)
	, m_dataType				(GL_NONE)
	, m_width					(0)
	, m_height					(0)
	, m_filenames				(filenames)
	, m_renderer				(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP)
	, m_caseNdx					(0)
{
}